

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

OwnPromiseNode kj::_::readyNow(void)

{
  int iVar1;
  PromiseNode *in_RDI;
  
  if (readyNow()::NODE == '\0') {
    iVar1 = __cxa_guard_acquire(&readyNow()::NODE);
    if (iVar1 != 0) {
      readyNow::NODE.super_ImmediatePromiseNodeBase.super_PromiseNode.super_PromiseArenaMember.arena
           = (PromiseArena *)0x0;
      readyNow::NODE.super_ImmediatePromiseNodeBase.super_PromiseNode.super_PromiseArenaMember.
      _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_0036d760;
      __cxa_atexit(ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase,&readyNow::NODE,&__dso_handle
                  );
      __cxa_guard_release(&readyNow()::NODE);
    }
  }
  (in_RDI->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)&readyNow::NODE;
  return (OwnPromiseNode)in_RDI;
}

Assistant:

OwnPromiseNode readyNow() {
  class ReadyNowPromiseNode: public ImmediatePromiseNodeBase {
    // This is like `ConstPromiseNode<Void, Void{}>`, but the compiler won't let me pass a literal
    // value of type `Void` as a template parameter. (Might require C++20?)

  public:
    void destroy() override {}
    void get(ExceptionOrValue& output) noexcept override {
      output.as<Void>() = Void();
    }
  };

  static ReadyNowPromiseNode NODE;
  return OwnPromiseNode(&NODE);
}